

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_encoder.cpp
# Opt level: O2

void __thiscall
encoder_rate_adapted_Hx_benchmark_unsafe_Test::encoder_rate_adapted_Hx_benchmark_unsafe_Test
          (encoder_rate_adapted_Hx_benchmark_unsafe_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001834d0;
  return;
}

Assistant:

TEST(encoder, rate_adapted_Hx_benchmark_unsafe) {
    constexpr std::size_t n_left_out_rate_adaption_steps = 2;
    std::array<Bit, AutogenLDPC::N> input{};
    std::array<Bit, AutogenLDPC::M> output{};
    std::array<Bit, AutogenLDPC::M/2 + n_left_out_rate_adaption_steps> ra_output{};

    constexpr int num_runs = 500;
    unsigned int seed = 0;
    long long runtime = 0;

    std::cout << "Performing " << num_runs
              << " encodings for matrix size " << AutogenLDPC::M << " x " << AutogenLDPC::N << std::endl;
    std::cout << "Matrix has " << AutogenLDPC::num_nz << " non-zero entries." << std::endl;

    for (; seed < num_runs; ++seed) {
        noise_bitstring_inplace(input, 0.5, seed);

        auto begin = std::chrono::steady_clock::now();

        encode(input, output);
        rate_adapt(output, ra_output);

        auto now = std::chrono::steady_clock::now();

        std::cout << "\rHash every run (makes sure the result is not optimized away): " << hash_vector(ra_output);

        auto elapsed = std::chrono::duration_cast<std::chrono::microseconds>(now - begin);
        runtime += elapsed.count();
    }
    std::cout << "\nAvg. runtime: " << static_cast<double>(runtime) / num_runs << " microseconds." << std::endl;
}